

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

Link * __thiscall DistanceGraph::get_link(DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  bool bVar1;
  reference __src;
  long in_RCX;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *in_RDX;
  long in_RSI;
  Link *in_RDI;
  Link *l;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<Link,_std::allocator<Link>_> *in_stack_ffffffffffffff98;
  Support local_40;
  Link *local_30;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_28;
  reference local_20;
  long local_18;
  
  if ((long)in_RDX < 1) {
    in_RDX = (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)-(long)in_RDX;
  }
  local_18 = in_RCX;
  local_20 = std::
             vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                           *)(in_RSI + 8),(size_type)in_RDX);
  local_28._M_current =
       (Link *)std::vector<Link,_std::allocator<Link>_>::begin(in_stack_ffffffffffffff98);
  local_30 = (Link *)std::vector<Link,_std::allocator<Link>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDX,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                               *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      Support::Support(&local_40,Undefined,0,0);
      Link::Link(in_RDI,0,0,0,local_40);
      return in_RDI;
    }
    __src = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
            operator*(&local_28);
    memcpy(in_RDI,__src,0x28);
    if (in_RDI->dest == local_18) break;
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
              (&local_28);
  }
  return in_RDI;
}

Assistant:

Link DistanceGraph::get_link(sgNodeID_t source, sgNodeID_t dest) {
    for (auto l:links[(source > 0 ? source : -source)]) {
        if (l.source==source,l.dest==dest) return l;
    }
    return Link(0,0,0);
}